

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::ScriptSet::displayScripts(ScriptSet *this,UnicodeString *dest)

{
  UnicodeString *this_00;
  UnicodeString local_68;
  char *local_28;
  char *scriptName;
  int32_t i;
  UBool firstTime;
  UnicodeString *dest_local;
  ScriptSet *this_local;
  
  scriptName._7_1_ = '\x01';
  _i = dest;
  dest_local = (UnicodeString *)this;
  for (scriptName._0_4_ = nextSetBit(this,0); USCRIPT_INVALID_CODE < (UScriptCode)scriptName;
      scriptName._0_4_ = nextSetBit(this,(UScriptCode)scriptName + USCRIPT_INHERITED)) {
    if (scriptName._7_1_ == '\0') {
      UnicodeString::append(_i,L' ');
    }
    scriptName._7_1_ = '\0';
    local_28 = uscript_getShortName_63((UScriptCode)scriptName);
    this_00 = _i;
    UnicodeString::UnicodeString(&local_68,local_28,-1,kInvariant);
    UnicodeString::append(this_00,&local_68);
    UnicodeString::~UnicodeString(&local_68);
  }
  return _i;
}

Assistant:

UnicodeString &ScriptSet::displayScripts(UnicodeString &dest) const {
    UBool firstTime = TRUE;
    for (int32_t i = nextSetBit(0); i >= 0; i = nextSetBit(i + 1)) {
        if (!firstTime) {
            dest.append((UChar)0x20);
        }
        firstTime = FALSE;
        const char *scriptName = uscript_getShortName((UScriptCode(i)));
        dest.append(UnicodeString(scriptName, -1, US_INV));
    }
    return dest;
}